

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffppxn(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,void *nulval,
          int *status)

{
  long firstelem_00;
  LONGLONG local_a8;
  LONGLONG naxes [9];
  LONGLONG dimsize;
  LONGLONG firstelem;
  long group;
  int ii;
  int naxis;
  void *nulval_local;
  void *array_local;
  LONGLONG nelem_local;
  long *firstpix_local;
  fitsfile *pfStack_18;
  int datatype_local;
  fitsfile *fptr_local;
  
  naxes[8] = 1;
  if (*status < 1) {
    _ii = (double *)nulval;
    nulval_local = array;
    array_local = (void *)nelem;
    nelem_local = (LONGLONG)firstpix;
    firstpix_local._4_4_ = datatype;
    pfStack_18 = fptr;
    if (nulval == (void *)0x0) {
      ffppx(fptr,datatype,firstpix,nelem,array,status);
      fptr_local._4_4_ = *status;
    }
    else {
      ffgidm(fptr,(int *)((long)&group + 4),status);
      ffgiszll(pfStack_18,9,&local_a8,status);
      dimsize = 0;
      for (group._0_4_ = 0; (int)group < group._4_4_; group._0_4_ = (int)group + 1) {
        dimsize = (*(long *)(nelem_local + (long)(int)group * 8) + -1) * naxes[8] + dimsize;
        naxes[8] = naxes[(long)(int)group + -1] * naxes[8];
      }
      firstelem_00 = dimsize + 1;
      if (firstpix_local._4_4_ == 0xb) {
        ffppnb(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(uchar *)nulval_local,*(uchar *)_ii,
               status);
      }
      else if (firstpix_local._4_4_ == 0xc) {
        ffppnsb(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(char *)nulval_local,*(char *)_ii,
                status);
      }
      else if (firstpix_local._4_4_ == 0x14) {
        ffppnui(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(unsigned_short *)nulval_local,
                *(unsigned_short *)_ii,status);
      }
      else if (firstpix_local._4_4_ == 0x15) {
        ffppni(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(short *)nulval_local,*(short *)_ii,
               status);
      }
      else if (firstpix_local._4_4_ == 0x1e) {
        ffppnuk(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(uint *)nulval_local,
                (uint)*(float *)_ii,status);
      }
      else if (firstpix_local._4_4_ == 0x1f) {
        ffppnk(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(int *)nulval_local,
               (int)*(float *)_ii,status);
      }
      else if (firstpix_local._4_4_ == 0x28) {
        ffppnuj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(unsigned_long *)nulval_local,
                (unsigned_long)*_ii,status);
      }
      else if (firstpix_local._4_4_ == 0x29) {
        ffppnj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(long *)nulval_local,(long)*_ii,
               status);
      }
      else if (firstpix_local._4_4_ == 0x50) {
        ffppnujj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(ULONGLONG *)nulval_local,
                 (ULONGLONG)*_ii,status);
      }
      else if (firstpix_local._4_4_ == 0x51) {
        ffppnjj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(LONGLONG *)nulval_local,
                (LONGLONG)*_ii,status);
      }
      else if (firstpix_local._4_4_ == 0x2a) {
        ffppne(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(float *)nulval_local,*(float *)_ii,
               status);
      }
      else if (firstpix_local._4_4_ == 0x52) {
        ffppnd(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(double *)nulval_local,*_ii,status);
      }
      else {
        *status = 0x19a;
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffppxn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            long  *firstpix, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

  This routine supports writing to large images with
  more than 2**31 pixels.
*/
{
    int naxis, ii;
    long group = 1;
    LONGLONG firstelem, dimsize = 1, naxes[9];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffppx(fptr, datatype, firstpix, nelem, array, status);
        return(*status);
    }

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (datatype == TBYTE)
    {
      ffppnb(fptr, group, firstelem, nelem, (unsigned char *) array, 
             *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffppnsb(fptr, group, firstelem, nelem, (signed char *) array, 
             *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
      ffppnui(fptr, group, firstelem, nelem, (unsigned short *) array,
              *(unsigned short *) nulval,status);
    }
    else if (datatype == TSHORT)
    {
      ffppni(fptr, group, firstelem, nelem, (short *) array,
             *(short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffppnuk(fptr, group, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffppnk(fptr, group, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffppnuj(fptr, group, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval,status);
    }
    else if (datatype == TLONG)
    {
      ffppnj(fptr, group, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffppnujj(fptr, group, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffppnjj(fptr, group, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppne(fptr, group, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffppnd(fptr, group, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}